

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

void __thiscall
pybind11::arg_v::arg_v<SupportType>(arg_v *this,arg *base,SupportType *x,char *descr)

{
  undefined8 uVar1;
  handle hVar2;
  long lVar3;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar4;
  
  uVar1 = *(undefined8 *)&base->field_0x8;
  (this->super_arg).name = base->name;
  *(undefined8 *)&(this->super_arg).field_0x8 = uVar1;
  pVar4 = detail::type_caster_generic::src_and_type
                    (x,(type_info *)&SupportType::typeinfo,(type_info *)0x0);
  hVar2 = detail::type_caster_generic::cast
                    (pVar4.first,copy,(handle)0x0,pVar4.second,
                     anon_func::anon_class_1_0_00000001::__invoke,
                     anon_func::anon_class_1_0_00000001::__invoke,(void *)0x0);
  (this->value).super_handle.m_ptr = hVar2.m_ptr;
  this->descr = descr;
  lVar3 = PyErr_Occurred();
  if (lVar3 != 0) {
    PyErr_Clear();
  }
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    {
        // Workaround! See:
        // https://github.com/pybind/pybind11/issues/2336
        // https://github.com/pybind/pybind11/pull/2685#issuecomment-731286700
        if (PyErr_Occurred()) {
            PyErr_Clear();
        }
    }